

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 *puVar2;
  int *piVar3;
  ImVector<unsigned_short> *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  char cVar8;
  char cVar9;
  byte bVar10;
  ImDrawListSplitter *pIVar11;
  ImGuiTableColumn *pIVar12;
  ImDrawCmd *pIVar13;
  ImDrawChannel *pIVar14;
  ImDrawChannel *pIVar15;
  int iVar16;
  int iVar17;
  undefined8 uVar18;
  unsigned_short *puVar19;
  undefined8 uVar20;
  ImGuiContext *pIVar21;
  long lVar22;
  ulong uVar23;
  ImDrawChannel *pIVar24;
  int n;
  long lVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  byte bVar29;
  MergeGroup *merge_group;
  int iVar30;
  uint uVar31;
  int iVar32;
  float *pfVar33;
  ulong uVar34;
  uint uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  ImBitArray<132,_0> remaining_mask;
  MergeGroup merge_groups [4];
  ImBitArray<132,_0> local_f8;
  undefined8 uStack_e4;
  float fStack_dc;
  undefined8 local_d8;
  float afStack_d0 [2];
  int iStack_c8;
  uint local_c4 [37];
  
  pIVar21 = GImGui;
  pIVar11 = table->DrawSplitter;
  cVar8 = table->FreezeRowsCount;
  cVar9 = table->FreezeColumnsCount;
  lVar22 = 0x14;
  do {
    *(undefined8 *)((long)local_f8.Storage + lVar22 + 0xc) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar22) = 0;
    *(undefined8 *)((long)&local_d8 + lVar22) = 0;
    *(undefined8 *)((long)afStack_d0 + lVar22) = 0;
    *(undefined4 *)((long)&iStack_c8 + lVar22) = 0;
    *(undefined4 *)((long)&fStack_dc + lVar22) = 0;
    lVar22 = lVar22 + 0x28;
  } while (lVar22 != 0xb4);
  iVar30 = table->ColumnsCount;
  if (0 < iVar30) {
    uVar23 = 0;
    uVar28 = 0;
    do {
      if ((table->VisibleMaskByIndex >> (uVar23 & 0x3f) & 1) != 0) {
        pIVar12 = (table->Columns).Data;
        uVar35 = 1;
        do {
          bVar29 = (byte)uVar35;
          bVar10 = *(byte *)((long)&pIVar12[uVar23].Flags + ((ulong)uVar35 ^ 0x59));
          pIVar24 = (pIVar11->_Channels).Data;
          iVar30 = pIVar24[bVar10]._CmdBuffer.Size;
          lVar22 = (long)iVar30;
          if (0 < lVar22) {
            pIVar24 = pIVar24 + bVar10;
            pIVar13 = (pIVar24->_CmdBuffer).Data;
            if ((pIVar13[lVar22 + -1].ElemCount == 0) &&
               (pIVar13[lVar22 + -1].UserCallback == (ImDrawCallback)0x0)) {
              iVar30 = iVar30 + -1;
              (pIVar24->_CmdBuffer).Size = iVar30;
            }
            if (iVar30 == 1) {
              if ((pIVar12[uVar23].Flags & 0x100) == 0) {
                if (cVar8 < '\x01') {
                  fVar36 = pIVar12[uVar23].ContentMaxXUnfrozen;
LAB_00232235:
                  uVar35 = -(uint)(pIVar12[uVar23].ContentMaxXHeadersUsed <= fVar36);
                  fVar36 = (float)(~uVar35 & (uint)pIVar12[uVar23].ContentMaxXHeadersUsed |
                                  (uint)fVar36 & uVar35);
                }
                else {
                  if (bVar29 != 0) {
                    fVar36 = pIVar12[uVar23].ContentMaxXFrozen;
                    goto LAB_00232235;
                  }
                  fVar36 = pIVar12[uVar23].ContentMaxXUnfrozen;
                }
                pIVar1 = &pIVar12[uVar23].ClipRect.Max;
                if (pIVar1->x <= fVar36 && fVar36 != pIVar1->x) goto LAB_00232321;
              }
              if (cVar9 < '\x01') {
                uVar35 = 1;
              }
              else {
                uVar35 = (uint)((long)table->FreezeColumnsCount <= (long)uVar23);
              }
              uVar31 = ((byte)~bVar29 & 1) * 2;
              if (cVar8 < '\x01') {
                uVar31 = 2;
              }
              uVar26 = (ulong)(uVar31 | uVar35);
              pfVar33 = (float *)(&local_d8 + uVar26 * 5);
              iVar30 = local_c4[uVar26 * 10 + -1];
              if (iVar30 == 0) {
                pfVar33[0] = 3.4028235e+38;
                pfVar33[1] = 3.4028235e+38;
                (afStack_d0 + uVar26 * 10)[0] = -3.4028235e+38;
                (afStack_d0 + uVar26 * 10)[1] = -3.4028235e+38;
                fVar36 = 3.4028235e+38;
              }
              else {
                fVar36 = *pfVar33;
              }
              local_c4[uVar26 * 10 + (ulong)(bVar10 >> 5)] =
                   local_c4[uVar26 * 10 + (ulong)(bVar10 >> 5)] | 1 << (bVar10 & 0x1f);
              local_c4[uVar26 * 10 + -1] = iVar30 + 1;
              pIVar13 = (pIVar24->_CmdBuffer).Data;
              fVar5 = (pIVar13->ClipRect).x;
              if (fVar5 < fVar36) {
                *pfVar33 = fVar5;
              }
              fVar36 = (pIVar13->ClipRect).y;
              if (fVar36 < afStack_d0[uVar26 * 10 + -1]) {
                afStack_d0[uVar26 * 10 + -1] = fVar36;
              }
              fVar36 = (pIVar13->ClipRect).z;
              if (afStack_d0[uVar26 * 10] <= fVar36 && fVar36 != afStack_d0[uVar26 * 10]) {
                afStack_d0[uVar26 * 10] = fVar36;
              }
              fVar36 = (pIVar13->ClipRect).w;
              if (afStack_d0[uVar26 * 10 + 1] <= fVar36 && fVar36 != afStack_d0[uVar26 * 10 + 1]) {
                afStack_d0[uVar26 * 10 + 1] = fVar36;
              }
              uVar28 = uVar28 | 1 << (uVar31 | uVar35);
            }
          }
LAB_00232321:
          uVar35 = 0;
        } while (('\0' < cVar8 & bVar29) != 0);
        pIVar12[uVar23].DrawChannelCurrent = 0xff;
        iVar30 = table->ColumnsCount;
      }
      uVar23 = uVar23 + 1;
    } while ((long)uVar23 < (long)iVar30);
    if (uVar28 != 0) {
      iVar27 = pIVar11->_Count + -2;
      iVar30 = (pIVar21->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar30 < iVar27) {
        if (iVar30 == 0) {
          iVar30 = 8;
        }
        else {
          iVar30 = iVar30 / 2 + iVar30;
        }
        if (iVar30 <= iVar27) {
          iVar30 = iVar27;
        }
        pIVar24 = (ImDrawChannel *)MemAlloc((long)iVar30 << 5);
        pIVar14 = (pIVar21->DrawChannelsTempMergeBuffer).Data;
        if (pIVar14 != (ImDrawChannel *)0x0) {
          memcpy(pIVar24,pIVar14,(long)(pIVar21->DrawChannelsTempMergeBuffer).Size << 5);
          MemFree((pIVar21->DrawChannelsTempMergeBuffer).Data);
        }
        (pIVar21->DrawChannelsTempMergeBuffer).Data = pIVar24;
        (pIVar21->DrawChannelsTempMergeBuffer).Capacity = iVar30;
      }
      else {
        pIVar24 = (pIVar21->DrawChannelsTempMergeBuffer).Data;
      }
      (pIVar21->DrawChannelsTempMergeBuffer).Size = iVar27;
      local_f8.Storage[0] = 0;
      local_f8.Storage[1] = 0;
      local_f8.Storage[2] = 0;
      local_f8.Storage[3] = 0;
      local_f8.Storage[4] = 0;
      ImBitArray<132,_0>::SetBitRange(&local_f8,2,pIVar11->_Count);
      bVar10 = table->Bg2DrawChannelUnfrozen & 0x1f;
      local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] =
           local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] &
           (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
      iVar30 = (pIVar11->_Count - (uint)('\0' < cVar8)) + -2;
      fVar36 = (table->HostClipRect).Min.x;
      fVar5 = (table->HostClipRect).Min.y;
      fVar6 = (table->HostClipRect).Max.x;
      fVar7 = (table->HostClipRect).Max.y;
      lVar22 = (long)local_c4;
      uVar23 = 0;
      do {
        iVar27 = local_c4[uVar23 * 10 + -1];
        if (iVar27 != 0) {
          fVar37 = *(float *)(&local_d8 + uVar23 * 5);
          fVar38 = afStack_d0[uVar23 * 10 + -1];
          fVar40 = afStack_d0[uVar23 * 10];
          fVar39 = afStack_d0[uVar23 * 10 + 1];
          if (((uVar23 & 1) == 0 || cVar9 < '\x01') && (fVar36 <= fVar37)) {
            fVar37 = fVar36;
          }
          if ((uVar23 < 2 || cVar8 < '\x01') && (fVar5 <= fVar38)) {
            fVar38 = fVar5;
          }
          if ((uVar23 & 1) != 0) {
            uVar28 = -(uint)(fVar6 <= fVar40);
            fVar40 = (float)(~uVar28 & (uint)fVar6 | (uint)fVar40 & uVar28);
          }
          if ((1 < uVar23) && ((table->Flags & 0x20000) == 0)) {
            uVar28 = -(uint)(fVar7 <= fVar39);
            fVar39 = (float)(~uVar28 & (uint)fVar7 | (uint)fVar39 & uVar28);
          }
          lVar25 = 0;
          do {
            local_f8.Storage[lVar25] = local_f8.Storage[lVar25] & ~*(uint *)(lVar22 + lVar25 * 4);
            lVar25 = lVar25 + 1;
          } while (lVar25 != 5);
          iVar30 = iVar30 - iVar27;
          iVar32 = pIVar11->_Count;
          if (0 < iVar32) {
            lVar25 = 8;
            uVar26 = 0;
            do {
              uVar34 = uVar26 >> 5 & 0x7ffffff;
              if ((local_c4[uVar23 * 10 + uVar34] >> ((uint)uVar26 & 0x1f) & 1) != 0) {
                local_c4[uVar23 * 10 + uVar34] =
                     local_c4[uVar23 * 10 + uVar34] & ~(1 << ((byte)uVar26 & 0x1f));
                iVar27 = iVar27 + -1;
                pIVar14 = (pIVar11->_Channels).Data;
                pfVar33 = *(float **)((long)&(pIVar14->_CmdBuffer).Size + lVar25);
                *pfVar33 = fVar37;
                pfVar33[1] = fVar38;
                pfVar33[2] = fVar40;
                pfVar33[3] = fVar39;
                puVar2 = (undefined8 *)((long)pIVar14 + lVar25 + -8);
                uVar18 = *puVar2;
                pIVar13 = (ImDrawCmd *)puVar2[1];
                piVar3 = (int *)((long)&(pIVar14->_CmdBuffer).Data + lVar25);
                iVar32 = piVar3[1];
                iVar16 = piVar3[2];
                iVar17 = piVar3[3];
                (pIVar24->_IdxBuffer).Size = *piVar3;
                (pIVar24->_IdxBuffer).Capacity = iVar32;
                *(int *)&(pIVar24->_IdxBuffer).Data = iVar16;
                *(int *)((long)&(pIVar24->_IdxBuffer).Data + 4) = iVar17;
                (pIVar24->_CmdBuffer).Size = (int)uVar18;
                (pIVar24->_CmdBuffer).Capacity = (int)((ulong)uVar18 >> 0x20);
                (pIVar24->_CmdBuffer).Data = pIVar13;
                pIVar24 = pIVar24 + 1;
                iVar32 = pIVar11->_Count;
              }
              uVar26 = uVar26 + 1;
            } while (((long)uVar26 < (long)iVar32) && (lVar25 = lVar25 + 0x20, iVar27 != 0));
          }
        }
        if (uVar23 == 1 && '\0' < cVar8) {
          pIVar15 = (pIVar11->_Channels).Data;
          pIVar14 = pIVar15 + table->Bg2DrawChannelUnfrozen;
          iVar32 = (pIVar14->_CmdBuffer).Size;
          iVar16 = (pIVar14->_CmdBuffer).Capacity;
          pIVar13 = (pIVar14->_CmdBuffer).Data;
          pIVar4 = &pIVar15[table->Bg2DrawChannelUnfrozen]._IdxBuffer;
          iVar27 = pIVar4->Capacity;
          puVar19 = pIVar4->Data;
          (pIVar24->_IdxBuffer).Size = pIVar4->Size;
          (pIVar24->_IdxBuffer).Capacity = iVar27;
          (pIVar24->_IdxBuffer).Data = puVar19;
          (pIVar24->_CmdBuffer).Size = iVar32;
          (pIVar24->_CmdBuffer).Capacity = iVar16;
          (pIVar24->_CmdBuffer).Data = pIVar13;
          pIVar24 = pIVar24 + 1;
        }
        uVar23 = uVar23 + 1;
        lVar22 = lVar22 + 0x28;
      } while (uVar23 != 4);
      iVar27 = pIVar11->_Count;
      if ((0 < iVar27) && (iVar30 != 0)) {
        lVar22 = 0;
        uVar23 = 0;
        do {
          if ((local_f8.Storage[uVar23 >> 5 & 0x7ffffff] >> ((uint)uVar23 & 0x1f) & 1) != 0) {
            pIVar14 = (pIVar11->_Channels).Data;
            puVar2 = (undefined8 *)((long)&(pIVar14->_CmdBuffer).Size + lVar22);
            uVar18 = *puVar2;
            pIVar13 = (ImDrawCmd *)puVar2[1];
            puVar2 = (undefined8 *)((long)&(pIVar14->_IdxBuffer).Size + lVar22);
            uVar20 = *puVar2;
            puVar19 = (unsigned_short *)puVar2[1];
            (pIVar24->_IdxBuffer).Size = (int)uVar20;
            (pIVar24->_IdxBuffer).Capacity = (int)((ulong)uVar20 >> 0x20);
            (pIVar24->_IdxBuffer).Data = puVar19;
            (pIVar24->_CmdBuffer).Size = (int)uVar18;
            (pIVar24->_CmdBuffer).Capacity = (int)((ulong)uVar18 >> 0x20);
            (pIVar24->_CmdBuffer).Data = pIVar13;
            pIVar24 = pIVar24 + 1;
            iVar30 = iVar30 + -1;
            iVar27 = pIVar11->_Count;
          }
          uVar23 = uVar23 + 1;
        } while (((long)uVar23 < (long)iVar27) && (lVar22 = lVar22 + 0x20, iVar30 != 0));
      }
      memcpy((pIVar11->_Channels).Data + 2,(pIVar21->DrawChannelsTempMergeBuffer).Data,
             (long)iVar27 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0 && src_channel->_CmdBuffer.back().UserCallback == NULL) // Equivalent of PopUnusedDrawCmd()
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}